

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O2

int SUNMatScaleAdd_Dense(realtype c,SUNMatrix A,SUNMatrix B)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  iVar5 = SMCompatible_Dense(A,B);
  if (iVar5 == 0) {
    uVar6 = 0xfffffd43;
  }
  else {
    puVar1 = (uint *)A->content;
    uVar6 = 0;
    uVar3 = puVar1[1];
    if ((int)puVar1[1] < 1) {
      uVar3 = uVar6;
    }
    for (uVar7 = 0; uVar7 != uVar3; uVar7 = uVar7 + 1) {
      uVar4 = *puVar1;
      if ((int)*puVar1 < 1) {
        uVar4 = uVar6;
      }
      for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
        lVar2 = *(long *)(*(long *)(puVar1 + 6) + uVar7 * 8);
        *(double *)(lVar2 + uVar8 * 8) =
             *(double *)(lVar2 + uVar8 * 8) * c +
             *(double *)(*(long *)(*(long *)((long)B->content + 0x18) + uVar7 * 8) + uVar8 * 8);
      }
    }
  }
  return uVar6;
}

Assistant:

int SUNMatScaleAdd_Dense(realtype c, SUNMatrix A, SUNMatrix B)
{
  sunindextype i, j;

  /* Verify that A and B are compatible */
  if (!SMCompatible_Dense(A, B))
    return SUNMAT_ILL_INPUT;

  /* Perform operation */
  for (j=0; j<SM_COLUMNS_D(A); j++)
    for (i=0; i<SM_ROWS_D(A); i++)
      SM_ELEMENT_D(A,i,j) = c*SM_ELEMENT_D(A,i,j) + SM_ELEMENT_D(B,i,j);
  return SUNMAT_SUCCESS;
}